

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O1

void test_end(fitsfile *infits,FILE *out)

{
  int iVar1;
  int status;
  LONGLONG dataend;
  int hdutype;
  LONGLONG datastart;
  LONGLONG headstart;
  int local_3c;
  long local_38;
  int local_2c;
  LONGLONG local_28;
  LONGLONG local_20;
  
  local_3c = 0;
  ffmrhd(infits,1,&local_2c,&local_3c);
  if (local_3c == 0x6b) {
    local_3c = 0;
    ffcmsg();
    iVar1 = ffghadll(infits,&local_20,&local_28,&local_38,&local_3c);
    if (iVar1 != 0) {
      wrtferr(out,"",&local_3c,1);
    }
    iVar1 = ffmbyt(infits,local_38 + -1,0,&local_3c);
    if (iVar1 != 0) {
      sprintf(errmes,"Error trying to read last byte of the file at byte %ld.");
      wrterr(out,errmes,2);
      wrtout(out,"< End-of-File >");
      goto LAB_00108dd8;
    }
    ffmbyt(infits,local_38,0,&local_3c);
    if (local_3c != 0) {
      return;
    }
    wrtout(out,"< End-of-File >");
    sprintf(errmes,"File has extra byte(s) after last HDU at byte %ld.",local_38);
  }
  else {
    if (local_3c != 0) {
      wrtserr(out,"Bad HDU? ",&local_3c,2);
      return;
    }
    wrtout(out,"< End-of-File >");
    builtin_strncpy(errmes + 0x30,"st HDU.",8);
    builtin_strncpy(errmes,"There are extraneous HDU(s) beyond the end of la",0x30);
  }
  wrterr(out,errmes,2);
LAB_00108dd8:
  wrtout(out," ");
  return;
}

Assistant:

void  test_end(fitsfile *infits, 
		  FILE *out) 

{   
   int status = 0; 
   LONGLONG headstart, datastart, dataend;
   int hdutype;

   /* check whether there are any HDU left */ 
   fits_movrel_hdu(infits,1, &hdutype, &status);
   if (!status) {
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
    "There are extraneous HDU(s) beyond the end of last HDU.");
       wrterr(out,errmes,2);
       wrtout(out," ");
       return;
   }

   if (status != END_OF_FILE) { 
      wrtserr(out,"Bad HDU? ",&status,2);
      return;
   } 

   status = 0;  
   fits_clear_errmsg();
   if(ffghadll(infits, &headstart, &datastart, &dataend, &status)) 
       wrtferr(out, "",&status,1);

   /* try to move to the last byte of this extension.  */
   if (ffmbyt(infits, dataend - 1,0,&status))
   {
       sprintf(errmes, 
   "Error trying to read last byte of the file at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out,"< End-of-File >");
       wrtout(out," ");
       return;
   } 

   /* try to move to what would be the first byte of the next extension. 
     If successfull, we have a problem... */

   ffmbyt(infits, dataend,0,&status);
   if(status == 0) { 
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
     "File has extra byte(s) after last HDU at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out," ");
   } 

   return;
}